

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_enc.c
# Opt level: O0

int BackwardRefsClone(VP8LBackwardRefs *from,VP8LBackwardRefs *to)

{
  PixOrCopyBlock *pPVar1;
  VP8LBackwardRefs *in_RSI;
  long in_RDI;
  PixOrCopyBlock *block_to;
  PixOrCopyBlock *block_from;
  undefined8 *local_20;
  
  local_20 = *(undefined8 **)(in_RDI + 8);
  VP8LClearBackwardRefs(in_RSI);
  while( true ) {
    if (local_20 == (undefined8 *)0x0) {
      return 1;
    }
    pPVar1 = BackwardRefsNewBlock(in_RSI);
    if (pPVar1 == (PixOrCopyBlock *)0x0) break;
    memcpy(pPVar1->start,(void *)local_20[1],(long)*(int *)(local_20 + 2) << 3);
    pPVar1->size = *(int *)(local_20 + 2);
    local_20 = (undefined8 *)*local_20;
  }
  return 0;
}

Assistant:

static int BackwardRefsClone(const VP8LBackwardRefs* const from,
                             VP8LBackwardRefs* const to) {
  const PixOrCopyBlock* block_from = from->refs;
  VP8LClearBackwardRefs(to);
  while (block_from != NULL) {
    PixOrCopyBlock* const block_to = BackwardRefsNewBlock(to);
    if (block_to == NULL) return 0;
    memcpy(block_to->start, block_from->start,
           block_from->size * sizeof(PixOrCopy));
    block_to->size = block_from->size;
    block_from = block_from->next;
  }
  return 1;
}